

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O1

void __thiscall
Physical::Physical(Physical *this,string *name,string *unitPrefix,string *unitSymbol)

{
  pointer pcVar1;
  string local_d8;
  string local_b8;
  Unit local_98;
  
  this->_vptr_Physical = (_func_int **)&PTR__Physical_0015e4b0;
  (this->physicalDescription)._M_dataplus._M_p = (pointer)&(this->physicalDescription).field_2;
  (this->physicalDescription)._M_string_length = 0;
  (this->physicalDescription).field_2._M_local_buf[0] = '\0';
  Unit::Unit(&this->physicalUnit);
  std::__cxx11::string::_M_assign((string *)&this->physicalDescription);
  pcVar1 = (unitPrefix->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + unitPrefix->_M_string_length);
  pcVar1 = (unitSymbol->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + unitSymbol->_M_string_length);
  Unit::Unit(&local_98,&local_b8,&local_d8);
  (this->physicalUnit).nExpPrefix = local_98.nExpPrefix;
  *(undefined8 *)(this->physicalUnit).siUnits = local_98.siUnits._0_8_;
  *(ulong *)((this->physicalUnit).siUnits + 2) = CONCAT44(local_98.siUnits[3],local_98.siUnits[2]);
  *(ulong *)((this->physicalUnit).siUnits + 3) = CONCAT44(local_98.siUnits[4],local_98.siUnits[3]);
  *(undefined8 *)((this->physicalUnit).siUnits + 5) = local_98.siUnits._20_8_;
  (this->physicalUnit).bInvalid = local_98.bInvalid;
  Unit::setNames(&this->physicalUnit);
  Unit::~Unit(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Physical::Physical( string name, string unitPrefix, string unitSymbol )
{
	physicalDescription = name;
	physicalUnit = Unit(unitPrefix, unitSymbol);
}